

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

uint __thiscall ON_MeshNgonIterator::Count(ON_MeshNgonIterator *this)

{
  ON_MeshNgon *pOVar1;
  ON_MeshNgon **ppOVar2;
  ON_MeshNgon *ngon;
  uint ni;
  ON_MeshNgon **ngons;
  uint explicit_ngon_count;
  uint count;
  ON_MeshNgonIterator *this_local;
  
  ngons._4_4_ = 0;
  if (this->m_mesh != (ON_Mesh *)0x0) {
    ngons._4_4_ = ON_SimpleArray<ON_MeshFace>::UnsignedCount(&this->m_mesh->m_F);
    ngons._0_4_ = ON_Mesh::NgonUnsignedCount(this->m_mesh);
    if ((uint)ngons != 0) {
      ppOVar2 = ON_Mesh::Ngons(this->m_mesh);
      if (ppOVar2 != (ON_MeshNgon **)0x0) {
        for (ngon._4_4_ = 0; ngon._4_4_ < (uint)ngons; ngon._4_4_ = ngon._4_4_ + 1) {
          pOVar1 = ppOVar2[ngon._4_4_];
          if (pOVar1 == (ON_MeshNgon *)0x0) {
            ngons._0_4_ = (uint)ngons - 1;
          }
          else {
            if (ngons._4_4_ < pOVar1->m_Fcount) {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh_ngon.cpp"
                         ,0x15c7,"","Invalid ngon information on mesh");
              return 0;
            }
            ngons._4_4_ = ngons._4_4_ - pOVar1->m_Fcount;
          }
        }
      }
      ngons._4_4_ = (uint)ngons + ngons._4_4_;
    }
  }
  return ngons._4_4_;
}

Assistant:

unsigned int ON_MeshNgonIterator::Count() const
{
	unsigned int count = 0;

  if (nullptr != m_mesh)
  {
    count = m_mesh->m_F.UnsignedCount();
    unsigned int explicit_ngon_count = m_mesh->NgonUnsignedCount();
    if (explicit_ngon_count > 0)
    {
      // subtract the number of mesh faces that are in explicit ngons from count.
      const ON_MeshNgon* const * ngons = m_mesh->Ngons();
      if (nullptr != ngons)
      {
        for (unsigned int ni = 0; ni < explicit_ngon_count; ni++)
        {
          const ON_MeshNgon* ngon = ngons[ni];
          if (nullptr == ngon)
            explicit_ngon_count--;
          else if (ngon->m_Fcount <= count)
            count -= ngon->m_Fcount;
          else
          {
            ON_ERROR("Invalid ngon information on mesh");
            return 0;
          }
        }
      }

      // add the number of explicit ngons to count
      count += explicit_ngon_count;
    }
  }

  // return the number of explicit ngons + the number of faces that are not in an explicit ngon.
	return count;
}